

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa_milo.h
# Opt level: O2

DiyFp __thiscall DiyFp::NormalizeBoundary(DiyFp *this)

{
  ulong uVar1;
  int iVar2;
  DiyFp DVar3;
  
  iVar2 = this->e + -10;
  for (uVar1 = this->f; (uVar1 >> 0x35 & 1) == 0; uVar1 = uVar1 * 2) {
    iVar2 = iVar2 + -1;
  }
  DVar3.f = uVar1 << 10;
  DVar3.e = iVar2;
  DVar3._12_4_ = 0;
  return DVar3;
}

Assistant:

DiyFp NormalizeBoundary() const {
#if defined(_MSC_VER) && defined(_M_AMD64)
		unsigned long index;
		_BitScanReverse64(&index, f);
		return DiyFp (f << (63 - int(index)), e - (63 - int(index)));
#else
		DiyFp res = *this;
		while (!(res.f & (kDpHiddenBit << 1))) {
			res.f <<= 1;
			res.e--;
		}
		res.f <<= (kDiySignificandSize - kDpSignificandSize - 2);
		res.e = res.e - (kDiySignificandSize - kDpSignificandSize - 2);
		return res;
#endif
	}